

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O3

void nn_print_message(nn_options_t *options,char *buf,int buflen)

{
  ushort **ppuVar1;
  size_t __n;
  int iVar2;
  uint uVar3;
  size_t __size;
  int __c;
  char *pcVar4;
  uint uVar5;
  
  switch(options->echo_format) {
  case NN_NO_ECHO:
    return;
  case NN_ECHO_RAW:
    __n = (size_t)buflen;
    break;
  case NN_ECHO_ASCII:
    if (0 < buflen) {
      ppuVar1 = __ctype_b_loc();
      iVar2 = buflen + 1;
      do {
        __c = 0x2e;
        if (((*ppuVar1)[(int)*buf] >> 0xe & 1) != 0) {
          __c = (int)*buf;
        }
        fputc(__c,_stdout);
        buf = buf + 1;
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
    }
    fputc(10,_stdout);
    goto switchD_00103bea_default;
  case NN_ECHO_QUOTED:
    fputc(0x22,_stdout);
    if (0 < buflen) {
      iVar2 = buflen + 1;
      do {
        uVar3 = (uint)*buf;
        uVar5 = (uint)(byte)*buf;
        if (uVar5 < 0x22) {
          if (uVar5 == 10) {
            pcVar4 = "\\n";
          }
          else {
            if (uVar5 != 0xd) goto LAB_00103cfd;
            pcVar4 = "\\r";
          }
          fwrite(pcVar4,2,1,_stdout);
        }
        else {
          if ((uVar5 == 0x22) || (uVar5 == 0x5c)) {
            pcVar4 = "\\%c";
          }
          else {
LAB_00103cfd:
            ppuVar1 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar1 + (long)(int)uVar3 * 2 + 1) & 0x40) != 0) {
              fputc(uVar3,_stdout);
              goto LAB_00103d3a;
            }
            pcVar4 = "\\x%02x";
            uVar3 = uVar5;
          }
          fprintf(_stdout,pcVar4,(ulong)uVar3);
        }
LAB_00103d3a:
        buf = (char *)((byte *)buf + 1);
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
    }
    goto LAB_00103da1;
  case NN_ECHO_MSGPACK:
    if (buflen < 0x100) {
      fputc(-0x3c,_stdout);
      fputc(buflen,_stdout);
      __n = (size_t)buflen;
    }
    else {
      if ((uint)buflen < 0x10000) {
        fputc(-0x3b,_stdout);
        fputc((uint)buflen >> 8,_stdout);
      }
      else {
        fputc(-0x3a,_stdout);
        fputc((uint)buflen >> 0x18,_stdout);
        fputc((uint)buflen >> 0x10 & 0xff,_stdout);
        fputc((uint)buflen >> 8 & 0xff,_stdout);
      }
      fputc(buflen & 0xff,_stdout);
      __n = (size_t)(uint)buflen;
    }
    break;
  case NN_ECHO_HEX:
    fputc(0x22,_stdout);
    if (0 < buflen) {
      uVar3 = buflen + 1;
      do {
        fprintf(_stdout,"\\x%02x",(ulong)(byte)*buf);
        buf = (char *)((byte *)buf + 1);
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_00103da1:
    buf = "\"\n";
    __size = 2;
    __n = 1;
    goto LAB_00103e44;
  default:
    goto switchD_00103bea_default;
  }
  __size = 1;
LAB_00103e44:
  fwrite(buf,__size,__n,_stdout);
switchD_00103bea_default:
  fflush(_stdout);
  return;
}

Assistant:

void nn_print_message (nn_options_t *options, char *buf, int buflen)
{
    switch (options->echo_format) {
    case NN_NO_ECHO:
        return;
    case NN_ECHO_RAW:
        fwrite (buf, 1, buflen, stdout);
        break;
    case NN_ECHO_ASCII:
        for (; buflen > 0; --buflen, ++buf) {
            if (isprint (*buf)) {
                fputc (*buf, stdout);
            } else {
                fputc ('.', stdout);
            }
        }
        fputc ('\n', stdout);
        break;
    case NN_ECHO_QUOTED:
        fputc ('"', stdout);
        for (; buflen > 0; --buflen, ++buf) {
            switch (*buf) {
            case '\n':
                fprintf (stdout, "\\n");
                break;
            case '\r':
                fprintf (stdout, "\\r");
                break;
            case '\\':
            case '\"':
                fprintf (stdout, "\\%c", *buf);
                break;
            default:
                if (isprint (*buf)) {
                    fputc (*buf, stdout);
                } else {
                    fprintf (stdout, "\\x%02x", (unsigned char)*buf);
                }
            }
        }
        fprintf (stdout, "\"\n");
        break;
    case NN_ECHO_MSGPACK:
        if (buflen < 256) {
            fputc ('\xc4', stdout);
            fputc (buflen, stdout);
            fwrite (buf, 1, buflen, stdout);
        } else if (buflen < 65536) {
            fputc ('\xc5', stdout);
            fputc (buflen >> 8, stdout);
            fputc (buflen & 0xff, stdout);
            fwrite (buf, 1, buflen, stdout);
        } else {
            fputc ('\xc6', stdout);
            fputc (buflen >> 24, stdout);
            fputc ((buflen >> 16) & 0xff, stdout);
            fputc ((buflen >> 8) & 0xff, stdout);
            fputc (buflen & 0xff, stdout);
            fwrite (buf, 1, buflen, stdout);
        }
        break;
    case NN_ECHO_HEX:
        fputc ('"', stdout);
        for (; buflen > 0; --buflen, ++buf) {
             fprintf (stdout, "\\x%02x", (unsigned char)*buf);
        }
        fprintf (stdout, "\"\n");
        break;
    
    }
    fflush (stdout);
}